

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::BEQ_RL(CPU *this)

{
  byte bVar1;
  
  this->cycles = 2;
  bVar1 = GetByte(this);
  this->pc = this->pc + (short)(char)((char)((this->field_6).ps << 6) >> 7 & bVar1);
  return;
}

Assistant:

void CPU::BEQ_RL()
{
    cycles = 2;
    uint8_t offset = GetByte();
    pc += (Z) ? static_cast<int8_t>(offset) : 0;
}